

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

pair<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_bool>
 pdqsort_detail::
 partition_right<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
           (int *begin,int *end)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int iVar8;
  int *piVar9;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_bool>
  pVar10;
  
  piVar5 = (int *)0x8;
  while( true ) {
    iVar4 = (int)*(undefined8 *)begin;
    if ((iVar4 <= *(int *)((long)begin + (long)piVar5)) &&
       ((iVar8 = (int)((ulong)*(undefined8 *)begin >> 0x20),
        iVar4 < *(int *)((long)begin + (long)piVar5) ||
        (iVar8 <= *(int *)((long)(begin + 1) + (long)piVar5))))) break;
    piVar5 = piVar5 + 2;
  }
  piVar1 = (int *)((long)begin + (long)piVar5);
  if (piVar5 == (int *)0x8) {
    while (piVar6 = end, end = piVar6, piVar1 < piVar6) {
      uVar2 = piVar6[-2];
      piVar5 = (int *)(ulong)uVar2;
      end = piVar6 + -2;
      if (((int)uVar2 < iVar4) || (((int)uVar2 <= iVar4 && (piVar6[-1] < iVar8)))) break;
    }
  }
  else {
    do {
      piVar6 = end;
      uVar2 = piVar6[-2];
      piVar5 = (int *)(ulong)uVar2;
      end = piVar6 + -2;
      if ((int)uVar2 < iVar4) break;
    } while ((iVar4 < (int)uVar2) || (iVar8 <= piVar6[-1]));
  }
  piVar6 = end;
  piVar9 = piVar1;
  if (piVar1 < end) {
    do {
      iVar3 = *piVar9;
      *piVar9 = *piVar6;
      *piVar6 = iVar3;
      iVar3 = piVar9[1];
      piVar9[1] = piVar6[1];
      piVar6[1] = iVar3;
      do {
        do {
          piVar5 = piVar9;
          piVar9 = piVar5 + 2;
        } while (*piVar9 < iVar4);
      } while ((*piVar9 <= iVar4) && (piVar5[3] < iVar8));
      do {
        piVar7 = piVar6;
        piVar5 = piVar7 + -2;
        piVar6 = piVar5;
        if (piVar7[-2] < iVar4) break;
      } while ((iVar4 < piVar7[-2]) || (iVar8 <= piVar7[-1]));
    } while (piVar9 < piVar5);
  }
  pVar10._9_7_ = (undefined7)((ulong)piVar5 >> 8);
  pVar10.second = end <= piVar1;
  *begin = piVar9[-2];
  begin[1] = piVar9[-1];
  piVar9[-2] = iVar4;
  piVar9[-1] = iVar8;
  pVar10.first._M_current = (pair<int,_int> *)(piVar9 + -2);
  return pVar10;
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }